

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

UBool __thiscall
icu_63::ICUService::unregister(ICUService *this,URegistryKey rkey,UErrorCode *status)

{
  UBool UVar1;
  Mutex mutex;
  Mutex local_28;
  
  if ((rkey != (URegistryKey)0x0) && (this->factories != (UVector *)0x0)) {
    local_28.fMutex = (UMutex *)icu_63::lock;
    umtx_lock_63((UMutex *)icu_63::lock);
    UVar1 = UVector::removeElement(this->factories,rkey);
    if (UVar1 == '\0') {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      (**(code **)(*rkey + 8))(rkey);
    }
    else {
      (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x12])(this);
    }
    Mutex::~Mutex(&local_28);
    if (UVar1 != '\0') {
      (*(this->super_ICUNotifier)._vptr_ICUNotifier[4])(this);
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

UBool 
ICUService::unregister(URegistryKey rkey, UErrorCode& status) 
{
    ICUServiceFactory *factory = (ICUServiceFactory*)rkey;
    UBool result = FALSE;
    if (factory != NULL && factories != NULL) {
        Mutex mutex(&lock);

        if (factories->removeElement(factory)) {
            clearCaches();
            result = TRUE;
        } else {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            delete factory;
        }
    }
    if (result) {
        notifyChanged();
    }
    return result;
}